

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedCloseWebSocket::afterSendClosed
          (DelayedCloseWebSocket *this)

{
  Coroutine<void> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  long in_RSI;
  PromiseAwaiter<void> *__return_storage_ptr__;
  
  handle._M_fr_ptr = operator_new(0x400);
  *(code **)handle._M_fr_ptr = afterSendClosed;
  *(code **)((long)handle._M_fr_ptr + 8) = afterSendClosed;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  location.function = "afterSendClosed";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 7000;
  location.columnNumber = 0x17;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  *(undefined1 *)(in_RSI + 0x28) = 1;
  if ((*(char *)(in_RSI + 0x29) == '\x01') && (*(char *)(in_RSI + 0x18) == '\x01')) {
    this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x3f0);
    this_01->ptr = *(PromiseNode **)(in_RSI + 0x20);
    *(undefined8 *)(in_RSI + 0x20) = 0;
    Maybe<kj::Promise<void>_>::operator=((Maybe<kj::Promise<void>_> *)(in_RSI + 0x18));
    __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
    co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x3f8) = 0;
    bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar1) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
  }
  kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
            ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x3f8) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> afterSendClosed() {
      sentClose = true;
      if (receivedClose) {
        KJ_IF_SOME(t, completionTask) {
          auto result = kj::mv(t);
          completionTask = kj::none;
          co_await result;
        }
      }
    }